

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

int __thiscall QCss::ValueExtractor::lengthValue(ValueExtractor *this,Declaration *decl)

{
  QVariant *this_00;
  DeclarationData *pDVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  QMetaType QVar5;
  LengthData *data;
  PrivateShared *pPVar6;
  long in_FS_OFFSET;
  LengthData LVar7;
  LengthData t;
  undefined1 local_58 [16];
  QVariant local_48;
  long local_28;
  
  data = (LengthData *)local_58;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (decl->d).d.ptr;
  uVar2 = *(ulong *)&(pDVar1->parsed).d.field_0x18;
  if (uVar2 < 4) {
    if ((pDVar1->values).d.size == 0) {
      iVar4 = 0;
      goto LAB_005e56df;
    }
    local_58._0_8_ = (QMetaTypeInterface *)0xffffffffffffffff;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    LVar7 = lengthValue(this,(pDVar1->values).d.ptr);
    local_58._0_8_ = LVar7.number;
    local_58._8_4_ = LVar7.unit;
    this_00 = (QVariant *)(local_58 + 0x10);
    ::QVariant::QVariant(this_00,(QMetaType)0x809308,local_58);
    ::QVariant::operator=(&((decl->d).d.ptr)->parsed,this_00);
    ::QVariant::~QVariant(this_00);
  }
  else {
    pPVar6 = (PrivateShared *)&pDVar1->parsed;
    local_58._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCss::LengthData>::metaType;
    local_48.d.data.shared = (PrivateShared *)(uVar2 & 0xfffffffffffffffc);
    bVar3 = comparesEqual((QMetaType *)(local_58 + 0x10),(QMetaType *)local_58);
    if (bVar3) {
      if (((pDVar1->parsed).d.field_0x18 & 1) != 0) {
        pPVar6 = (((QVariant *)pPVar6)->d).data.shared;
        pPVar6 = pPVar6 + *(int *)(pPVar6 + 4);
      }
      local_48.d.data.shared = (((Private *)&pPVar6->field_0x0)->data).shared;
      local_48.d.data._8_8_ = *(undefined8 *)&pPVar6[8].field_0x0;
    }
    else {
      local_48.d.data.shared = (PrivateShared *)0x0;
      local_48.d.data._8_8_ = 0;
      QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((pDVar1->parsed).d.field_0x18 & 1) != 0) {
        pPVar6 = (((QVariant *)pPVar6)->d).data.shared;
        pPVar6 = pPVar6 + *(int *)(pPVar6 + 4);
      }
      QMetaType::convert(QVar5,pPVar6,(QMetaType)local_58._0_8_,local_58 + 0x10);
    }
    data = (LengthData *)(local_58 + 0x10);
  }
  iVar4 = lengthValueFromData(data,&this->f);
LAB_005e56df:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int ValueExtractor::lengthValue(const Declaration &decl)
{
    if (decl.d->parsed.isValid())
        return  lengthValueFromData(qvariant_cast<LengthData>(decl.d->parsed), f);
    if (decl.d->values.size() < 1)
        return 0;
    LengthData data = lengthValue(decl.d->values.at(0));
    decl.d->parsed = QVariant::fromValue<LengthData>(data);
    return lengthValueFromData(data,f);
}